

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_strategy.h
# Opt level: O0

void __thiscall charls::encoder_strategy::end_scan(encoder_strategy *this)

{
  encoder_strategy *this_local;
  
  flush(this);
  if ((this->is_ff_written_ & 1U) != 0) {
    append_to_bit_stream(this,0,(this->free_bit_count_ + -1) % 8);
  }
  flush(this);
  if (this->free_bit_count_ == 0x20) {
    return;
  }
  __assert_fail("free_bit_count_ == 32",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/encoder_strategy.h"
                ,0x5a,"void charls::encoder_strategy::end_scan()");
}

Assistant:

void end_scan()
    {
        flush();

        // if a 0xff was written, Flush() will force one unset bit anyway
        if (is_ff_written_)
        {
            append_to_bit_stream(0, (free_bit_count_ - 1) % 8);
        }

        flush();
        ASSERT(free_bit_count_ == 32);
    }